

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O1

void __thiscall helics::tcp::TcpComms::queue_tx_function(TcpComms *this)

{
  _Atomic_word *p_Var1;
  ulong uVar2;
  _Rb_tree_node_base *p_Var3;
  TcpConnection *pTVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  TcpComms *this_00;
  undefined4 uVar6;
  element_type *this_01;
  bool bVar7;
  int iVar8;
  uint uVar9;
  _Head_base<0UL,_asio::io_context::work_*,_false> _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  _Rb_tree_node_base *p_Var12;
  _Head_base<0UL,_asio::io_context::work_*,_false> _Var13;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  ActionMessage *command;
  const_iterator __first;
  ulong uVar15;
  _Alloc_hider _Var16;
  string *in_R8;
  string_view message;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  pVar17;
  string interface;
  string newroute;
  string port;
  ActionMessage m;
  pointer brokerConnection;
  LoopHandle contextLoop;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  routes;
  _Alloc_hider local_2b8;
  _Base_ptr local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  TcpComms *local_258;
  undefined4 local_250;
  uint local_22c;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [160];
  shared_ptr<gmlc::networking::TcpConnection> local_168;
  BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *local_158;
  undefined1 local_150 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_140;
  undefined1 local_138 [24];
  undefined1 local_120 [8];
  undefined1 local_118 [24];
  undefined1 local_100 [24];
  undefined1 local_e8 [56];
  pointer local_b0;
  pointer pcStack_a8;
  undefined8 local_a0;
  undefined1 auStack_98 [48];
  _Manager_type p_Stack_68;
  undefined1 local_60 [16];
  _Any_data local_50 [2];
  undefined8 uVar14;
  
  local_228._8_8_ = (TcpConnection *)0x0;
  local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffffffffff00;
  local_228._0_8_ = &local_218;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)(local_150 + 8),(string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ != &local_218) {
    operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
  }
  if ((this->super_NetworkCommsInterface).encrypted == true) {
    gmlc::networking::SocketFactory::SocketFactory
              ((SocketFactory *)local_138,&this->encryption_config,true);
  }
  else {
    local_138._0_8_ = (element_type *)0x0;
    local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_138._16_8_ = 0;
  }
  gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)local_150);
  local_168.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (TcpConnection *)0x0;
  local_168.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var12 = (_Rb_tree_node_base *)(local_118 + 8);
  local_118._8_4_ = _S_red;
  local_118._16_8_ = (_Rb_tree_node_base *)0x0;
  local_100._16_8_ = 0;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  local_100._0_8_ = p_Var12;
  local_100._8_8_ = p_Var12;
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
      iVar8 = getDefaultPort(6);
      LOCK();
      (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar8;
      UNLOCK();
      ActionMessage::ActionMessage((ActionMessage *)local_228,cmd_protocol);
      local_228._4_4_ = 0x5ab;
      local_218._M_allocated_capacity._4_4_ =
           (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
      gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 &this->rxMessageQueue,(ActionMessage *)local_228);
      ActionMessage::~ActionMessage((ActionMessage *)local_228);
    }
  }
  else {
    bVar7 = establishBrokerConnection
                      (this,(shared_ptr<gmlc::networking::AsioContextManager> *)(local_150 + 8),
                       &local_168);
    if (!bVar7) {
      ActionMessage::ActionMessage((ActionMessage *)local_228,cmd_protocol);
      local_228._4_4_ = 0x16570bf;
      gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 &this->rxMessageQueue,(ActionMessage *)local_228);
      ActionMessage::~ActionMessage((ActionMessage *)local_228);
      goto LAB_0026dd9e;
    }
  }
  CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
  local_120 = (undefined1  [8])&(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
  local_158 = (BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
              &this->rxMessageQueue;
  local_22c = (uint)CONCAT71((int7)((ulong)local_158 >> 8),1);
  local_258 = this;
  do {
    local_e8._0_8_ = 0;
    local_e8._8_8_ = 0x9aac0f0000000000;
    local_e8._16_8_ = (__pthread_internal_list *)0x9aac0f0000000000;
    auStack_98._40_8_ = 0;
    p_Stack_68 = (_Manager_type)0x0;
    auStack_98._24_8_ = 0;
    auStack_98._32_8_ = (void *)0x0;
    auStack_98._8_8_ = 0;
    auStack_98._16_8_ = 0;
    local_a0._0_1_ = (__atomic_base<bool>)0x0;
    local_a0._1_1_ = false;
    local_a0._2_6_ = 0;
    auStack_98._0_8_ = 0;
    local_b0 = (pointer)0x0;
    pcStack_a8 = (pointer)0x0;
    local_e8._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_e8._48_8_ = (__pthread_internal_list *)0x0;
    local_e8._24_8_ = 0;
    local_e8._32_8_ = (element_type *)0x0;
    local_60._0_8_ = (_Invoker_type)0x40;
    local_60._8_8_ = &pcStack_a8;
    local_50[1]._0_8_ = (__pthread_internal_list *)0x0;
    local_50[1]._M_unused._8_8_ = (_Invoker_type)0x0;
    local_50[0]._M_unused._M_object = (void *)0x0;
    local_50[0]._8_8_ = 0;
    gmlc::containers::
    BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
    ::pop((pair<helics::route_id,_helics::ActionMessage> *)local_228,
          (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
           *)local_120);
    uVar6 = local_228._0_4_;
    pTVar4 = (TcpConnection *)(local_228 + 8);
    __first._M_node = (_Base_ptr)pTVar4;
    ActionMessage::operator=((ActionMessage *)local_e8,(ActionMessage *)pTVar4);
    ActionMessage::~ActionMessage((ActionMessage *)pTVar4);
    if ((((local_e8._0_4_ == -60000) || (local_e8._0_4_ == 0x1000ea60)) || (local_e8._0_4_ == 60000)
        ) && (uVar6 == cmd_broker_setup)) {
      bVar7 = false;
      if ((int)local_e8._4_4_ < 0x9db) {
        if (local_e8._4_4_ == 0xf4) {
          local_228._0_4_ = local_e8._20_4_;
          pVar17 = std::
                   _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                   ::equal_range((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                                  *)local_118,(key_type *)local_228);
          __first._M_node = (_Base_ptr)pVar17.first._M_node;
          std::
          _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
          ::_M_erase_aux((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                          *)local_118,__first,(_Base_ptr)pVar17.second._M_node);
        }
        else {
          if (local_e8._4_4_ != 0xe9) goto LAB_0026cf40;
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_298,local_60._8_8_,p_Stack_68 + local_60._8_8_);
          local_2b8._M_p = (pointer)&local_2a8;
          local_2b0 = (_Base_ptr)0x0;
          local_2a8._M_local_buf[0] = '\0';
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          local_278._M_string_length = 0;
          local_278.field_2._M_local_buf[0] = '\0';
          gmlc::networking::extractInterfaceAndPortString
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_228,&local_298);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(&local_278,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 0x10)) {
            operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._0_8_ != &local_218) {
            operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
          }
          in_R8 = (string *)&local_278;
          p_Var12 = (_Rb_tree_node_base *)&local_2b8;
          gmlc::networking::TcpConnection::create
                    ((TcpConnection *)local_228,(SocketFactory *)local_138,
                     (((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)
                      (local_150._8_8_ + 0x40))->_M_t).
                     super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                     .super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,
                     (string *)&local_2b8,in_R8,0x27d0);
          local_250 = local_e8._20_4_;
          __first._M_node = (_Base_ptr)&local_250;
          std::
          _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
          ::_M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                    ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                      *)local_118,(route_id *)__first._M_node,
                     (shared_ptr<gmlc::networking::TcpConnection> *)local_228);
          if ((TcpConnection *)local_228._8_8_ != (TcpConnection *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            __first._M_node =
                 (_Base_ptr)
                 (CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                           local_278.field_2._M_local_buf[0]) + 1);
            operator_delete(local_278._M_dataplus._M_p,(ulong)__first._M_node);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_p != &local_2a8) {
            __first._M_node =
                 (_Base_ptr)
                 (CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1);
            operator_delete(local_2b8._M_p,(ulong)__first._M_node);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            __first._M_node = (_Base_ptr)(local_298.field_2._M_allocated_capacity + 1);
            operator_delete(local_298._M_dataplus._M_p,(ulong)__first._M_node);
          }
        }
        bVar7 = true;
      }
      else if (local_e8._4_4_ == 0x9db) {
        bVar7 = true;
        local_22c = 0;
      }
      else if (local_e8._4_4_ == 0x16570bf) {
        bVar7 = true;
        __first._M_node = (_Base_ptr)local_e8;
        gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
        push<helics::ActionMessage&>(local_158,(ActionMessage *)local_e8);
      }
    }
    else {
      bVar7 = false;
    }
LAB_0026cf40:
    this_01 = local_168.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (!bVar7) {
      if (uVar6 == cmd_broker_setup) {
        __first._M_node = (_Base_ptr)local_e8;
        gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
        push<helics::ActionMessage&>(local_158,(ActionMessage *)local_e8);
      }
      else {
        iVar8 = (int)(TcpConnection *)local_228;
        if (uVar6 == cmd_ignore) {
          if (((local_258->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
            ActionMessage::packetize_abi_cxx11_((string *)local_228,(ActionMessage *)local_e8);
            __first._M_node = (_Base_ptr)local_228;
            gmlc::networking::TcpConnection::send(this_01,iVar8,__buf,(size_t)p_Var12,(int)in_R8);
            goto LAB_0026d0d1;
          }
        }
        else {
          _Var10._M_head_impl = (work *)(local_118 + 8);
          for (_Var13._M_head_impl = (work *)local_118._16_8_;
              (_Rb_tree_node_base *)_Var13._M_head_impl != (_Rb_tree_node_base *)0x0;
              _Var13._M_head_impl =
                   (work *)_Var13._M_head_impl
                           [(ulong)((int)((_Rb_tree_node_base *)(_Var13._M_head_impl + 4))->_M_color
                                   < (int)uVar6) + 2].io_context_impl_) {
            if ((int)uVar6 <= (int)((_Rb_tree_node_base *)(_Var13._M_head_impl + 4))->_M_color) {
              _Var10._M_head_impl = _Var13._M_head_impl;
            }
          }
          p_Var3 = (_Rb_tree_node_base *)(local_118 + 8);
          p_Var12 = p_Var3;
          if (((_Rb_tree_node_base *)_Var10._M_head_impl != p_Var3) &&
             (p_Var12 = (_Rb_tree_node_base *)_Var10._M_head_impl,
             (int)uVar6 < (int)((_Rb_tree_node_base *)((long)_Var10._M_head_impl + 0x20))->_M_color)
             ) {
            p_Var12 = p_Var3;
          }
          if (p_Var12 == p_Var3) {
            if (((local_258->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
              ActionMessage::packetize_abi_cxx11_((string *)local_228,(ActionMessage *)local_e8);
              __first._M_node = (_Base_ptr)local_228;
              gmlc::networking::TcpConnection::send
                        (this_01,iVar8,__buf_01,(size_t)p_Var12,(int)in_R8);
              goto LAB_0026d0d1;
            }
            if (0x86 < (int)local_e8._0_4_) {
              uVar9 = local_e8._0_4_ - 0x3ee;
              p_Var12 = (_Rb_tree_node_base *)(ulong)uVar9;
              if (((3 < uVar9) || (uVar9 == 1)) &&
                 ((local_e8._0_4_ != 0x87 && (local_e8._0_4_ != 0x89)))) goto LAB_0026d311;
              goto LAB_0026d0f6;
            }
            uVar9 = local_e8._0_4_ + 3;
            if ((uVar9 < 0x27) &&
               ((p_Var12 = (_Rb_tree_node_base *)0x600001fe1,
                (0x600001fe1U >> ((ulong)uVar9 & 0x3f) & 1) != 0 ||
                (((ulong)uVar9 == 0x26 &&
                 ((element_type *)local_e8._32_8_ == (element_type *)0x7fffffffffffffff))))))
            goto LAB_0026d0f6;
LAB_0026d311:
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_298,"(tcp) unknown message destination message dropped ","")
            ;
            prettyPrintString_abi_cxx11_((string *)&local_2b8,(helics *)local_e8,command);
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              uVar14 = local_298.field_2._M_allocated_capacity;
            }
            uVar2 = (long)&((_Alloc_hider *)local_298._M_string_length)->_M_p +
                    (long)&local_2b0->_M_color;
            in_R8 = (string *)local_298._M_string_length;
            if ((ulong)uVar14 < uVar2) {
              uVar15 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_p != &local_2a8) {
                uVar15 = CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]);
              }
              if (uVar15 < uVar2) goto LAB_0026d387;
              pbVar11 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_2b8,0,0,local_298._M_dataplus._M_p,
                                   local_298._M_string_length);
            }
            else {
LAB_0026d387:
              pbVar11 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_298,local_2b8._M_p,(size_type)local_2b0);
            }
            local_228._0_8_ = &local_218;
            paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar11->_M_dataplus)._M_p;
            p_Var12 = (_Rb_tree_node_base *)&pbVar11->field_2;
            if ((_Rb_tree_node_base *)paVar5 == p_Var12) {
              local_218._M_allocated_capacity = *(undefined8 *)p_Var12;
              local_218._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            }
            else {
              local_218._M_allocated_capacity = *(undefined8 *)p_Var12;
              local_228._0_8_ = paVar5;
            }
            __first._M_node = (_Base_ptr)pbVar11->_M_string_length;
            (pbVar11->_M_dataplus)._M_p = (pointer)p_Var12;
            pbVar11->_M_string_length = 0;
            *(char *)p_Var12 = '\0';
            message._M_str = (char *)local_228._0_8_;
            message._M_len = (size_t)__first._M_node;
            local_228._8_8_ = __first._M_node;
            CommsInterface::logWarning((CommsInterface *)local_258,message);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._0_8_ != &local_218) {
              __first._M_node = (_Base_ptr)(local_218._M_allocated_capacity + 1);
              operator_delete((void *)local_228._0_8_,(ulong)__first._M_node);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_p != &local_2a8) {
              __first._M_node =
                   (_Base_ptr)
                   (CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1);
              operator_delete(local_2b8._M_p,(ulong)__first._M_node);
            }
            uVar14 = local_298.field_2._M_allocated_capacity;
            _Var16._M_p = local_298._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p == &local_298.field_2) goto LAB_0026d0f6;
          }
          else {
            pTVar4 = (TcpConnection *)p_Var12[1]._M_parent;
            ActionMessage::packetize_abi_cxx11_((string *)local_228,(ActionMessage *)local_e8);
            __first._M_node = (_Base_ptr)local_228;
            gmlc::networking::TcpConnection::send(pTVar4,iVar8,__buf_00,(size_t)p_Var12,(int)in_R8);
LAB_0026d0d1:
            uVar14 = local_218._M_allocated_capacity;
            _Var16._M_p = (pointer)local_228._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._0_8_ == &local_218) goto LAB_0026d0f6;
          }
          __first._M_node = (_Base_ptr)(uVar14 + 1);
          operator_delete(_Var16._M_p,(ulong)__first._M_node);
        }
      }
    }
LAB_0026d0f6:
    ActionMessage::~ActionMessage((ActionMessage *)local_e8);
    this_00 = local_258;
  } while ((local_22c & 1) != 0);
  for (p_Var12 = (_Rb_tree_node_base *)local_100._0_8_;
      p_Var12 != (_Rb_tree_node_base *)(local_118 + 8);
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    gmlc::networking::TcpConnection::close
              ((TcpConnection *)p_Var12[1]._M_parent,(int)__first._M_node);
  }
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::clear((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
           *)local_118);
  if ((this_00->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
    closeReceiver(this_00);
  }
  CommsInterface::setTxStatus((CommsInterface *)this_00,TERMINATED);
LAB_0026dd9e:
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~_Rb_tree((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
               *)local_118);
  if (local_168.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_168.
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
  ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                 *)local_150);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_138._8_8_ + 0xc);
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = *(_Atomic_word *)(local_138._8_8_ + 0xc);
      *(int *)(local_138._8_8_ + 0xc) = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (**(code **)(*(long *)local_138._8_8_ + 0x18))();
    }
  }
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_pi);
  }
  return;
}

Assistant:

void TcpComms::queue_tx_function()
{
    // std::vector<char> buffer;
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto contextLoop = ioctx->startContextLoop();
    TcpConnection::pointer brokerConnection;

    std::map<route_id, TcpConnection::pointer> routes;  // for all the other possible routes
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (!establishBrokerConnection(ioctx, brokerConnection)) {
            ActionMessage m(CMD_PROTOCOL);
            m.messageID = CLOSE_RECEIVER;
            rxMessageQueue.push(m);
            return;
        }
    } else {
        if (PortNumber < 0) {
            PortNumber = getDefaultBrokerPort();
            ActionMessage m(CMD_PROTOCOL);
            m.messageID = PORT_DEFINITIONS;
            m.setExtraData(PortNumber);
            rxMessageQueue.push(m);
        }
    }
    setTxStatus(ConnectionStatus::CONNECTED);

    //  std::vector<ActionMessage> txlist;
    bool processing{true};
    while (processing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                switch (cmd.messageID) {
                    case NEW_ROUTE: {
                        std::string newroute(cmd.payload.to_string());

                        try {
                            std::string interface;
                            std::string port;
                            std::tie(interface, port) =
                                gmlc::networking::extractInterfaceAndPortString(newroute);
                            auto new_connect =
                                TcpConnection::create(sf, ioctx->getBaseContext(), interface, port);

                            routes.emplace(route_id{cmd.getExtraData()}, std::move(new_connect));
                        }
                        catch (std::exception& e) {
                            logWarning(std::string("unable to create route ") + newroute +
                                       "::" + e.what());
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        rxMessageQueue.push(cmd);
                        processed = true;
                        break;
                    case DISCONNECT:
                        processing = false;
                        processed = true;
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if (hasBroker) {
                try {
                    brokerConnection->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("broker send 0 ") +
                                     actionMessageType(cmd.action()) + ':' + se.what());
                        }
                    }
                }

                // if (error)
                {
                    //     std::cerr << "transmit failure to broker " << error.message() <<
                    //     '\n';
                }
            }
        } else if (rid == control_route) {  // send to rx thread loop
            rxMessageQueue.push(cmd);
        } else {
            //  txlist.push_back(cmd);
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                try {
                    rt_find->second->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("rt send ") + std::to_string(rid.baseValue()) +
                                     "::" + se.what());
                        }
                    }
                }
            } else {
                if (hasBroker) {
                    try {
                        brokerConnection->send(cmd.packetize());
                    }
                    catch (const std::system_error& se) {
                        if (se.code() != asio::error::connection_aborted) {
                            if (!isDisconnectCommand(cmd)) {
                                logError(std::string("broker send") +
                                         std::to_string(rid.baseValue()) + " ::" + se.what());
                            }
                        }
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(
                            std::string("(tcp) unknown message destination message dropped ") +
                            prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    for (auto& rt : routes) {
        rt.second->close();
    }
    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        closeReceiver();
    }
    setTxStatus(ConnectionStatus::TERMINATED);
}